

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidator.cpp
# Opt level: O2

Result * CoreML::validateSchemaTypesIsMultiArray
                   (Result *__return_storage_ptr__,FeatureDescription *featureDesc,
                   ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,int shapeSizeMin,
                   int shapeSizeMax)

{
  int iVar1;
  ArrayFeatureType *pAVar2;
  ostream *poVar3;
  char *pcVar4;
  FeatureType *pFVar5;
  string sStack_1d8;
  stringstream out;
  ostream local_1a8 [376];
  
  pFVar5 = featureDesc->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar2 = Specification::FeatureType::multiarraytype(pFVar5);
    if (pAVar2->datatype_ == allowedArrayFeatureDataType) {
      pAVar2 = Specification::FeatureType::multiarraytype(pFVar5);
      iVar1 = (pAVar2->shape_).current_size_;
      if (shapeSizeMin <= iVar1 && iVar1 <= shapeSizeMax) {
        Result::Result(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&out);
      poVar3 = std::operator<<(local_1a8,"Unsupported array rank ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
      poVar3 = std::operator<<(poVar3," should be in range [");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,shapeSizeMin);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,shapeSizeMax);
      poVar3 = std::operator<<(poVar3,"]");
      poVar3 = std::operator<<(poVar3,".");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&sStack_1d8);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&out);
      poVar3 = std::operator<<(local_1a8,"Unsupported array type \"");
      pAVar2 = Specification::FeatureType::multiarraytype(pFVar5);
      pcVar4 = MLArrayDataType_Name(pAVar2->datatype_);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"\" for feature \"");
      std::operator+(&sStack_1d8,(featureDesc->name_).ptr_,"\". ");
      poVar3 = std::operator<<(poVar3,(string *)&sStack_1d8);
      poVar3 = std::operator<<(poVar3,"Should be of: ");
      pcVar4 = MLArrayDataType_Name(allowedArrayFeatureDataType);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,".");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&sStack_1d8);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&out);
    poVar3 = std::operator<<(local_1a8,"Unsupported type \"");
    pFVar5 = featureDesc->type_;
    if (pFVar5 == (FeatureType *)0x0) {
      pFVar5 = (FeatureType *)&Specification::_FeatureType_default_instance_;
    }
    pcVar4 = ::MLFeatureTypeType_Name(pFVar5->_oneof_case_[0]);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\" for feature \"");
    std::operator+(&sStack_1d8,(featureDesc->name_).ptr_,"\". ");
    poVar3 = std::operator<<(poVar3,(string *)&sStack_1d8);
    poVar3 = std::operator<<(poVar3,"Should be of: ");
    poVar3 = std::operator<<(poVar3,"MLFeatureTypeType_multiArrayType");
    poVar3 = std::operator<<(poVar3," with data type of: ");
    pcVar4 = MLArrayDataType_Name(allowedArrayFeatureDataType);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,".");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&sStack_1d8);
  }
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateSchemaTypesIsMultiArray(const Specification::FeatureDescription& featureDesc,
                                           Specification::ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,
                                           int shapeSizeMin = 1,
                                           int shapeSizeMax = INT_MAX) {
        // Check the types
        auto& type = featureDesc.type();
        if (!type.has_multiarraytype() || type.Type_case() != Specification::FeatureType::kMultiArrayType) {
            // Invalid type
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(featureDesc.type().Type_case()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::FeatureType::kMultiArrayType))
            << " with data type of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        if (type.multiarraytype().datatype() != allowedArrayFeatureDataType) {
            std::stringstream out;
            out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(type.multiarraytype().datatype()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        int shapeSize = type.multiarraytype().shape_size();
        if (shapeSize<shapeSizeMin || shapeSizeMax < shapeSize) {
            std::stringstream out;
            out << "Unsupported array rank " << shapeSize
            << " should be in range [" << shapeSizeMin << "," << shapeSizeMax << "]"
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        // no invariant broken -- type matches one of the allowed types
        return Result();
    }